

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int http_parse(HTTP_INFO *hi)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  long len;
  char *p2;
  char *p1;
  HTTP_INFO *hi_local;
  
  if (hi->r_len < 1) {
    return -1;
  }
  p2 = hi->r_buf;
  while( true ) {
    while( true ) {
      while( true ) {
        while (hi->header_end == '\0') {
          pcVar1 = strstr(p2,"\r\n");
          if (pcVar1 == (char *)0x0) {
            sVar2 = hi->r_len - ((long)p2 - (long)hi->r_buf);
            if ((long)sVar2 < 1) {
              hi->r_len = 0;
            }
            else {
              strncpy(hi->r_buf,p2,sVar2);
              *(undefined1 *)((long)hi + sVar2 + 0x2210) = 0;
              hi->r_len = sVar2;
            }
            return 0;
          }
          *pcVar1 = '\0';
          if ((long)pcVar1 - (long)p2 < 1) {
            hi->header_end = '\x01';
            p2 = pcVar1 + 2;
            if ((hi->response).chunked == '\x01') {
              sVar2 = hi->r_len - ((long)p2 - (long)hi->r_buf);
              if ((long)sVar2 < 1) {
                hi->r_len = 0;
                hi->length = -1;
                return 0;
              }
              pcVar1 = strstr(p2,"\r\n");
              if (pcVar1 == (char *)0x0) {
                strncpy(hi->r_buf,p2,sVar2);
                *(undefined1 *)((long)hi + sVar2 + 0x2210) = 0;
                hi->r_len = sVar2;
                hi->length = -1;
                return 0;
              }
              *pcVar1 = '\0';
              lVar3 = strtol(p2,(char **)0x0,0x10);
              hi->length = lVar3;
              if (lVar3 == 0) {
                (hi->response).chunked = '\0';
              }
              else {
                (hi->response).content_length = hi->length + (hi->response).content_length;
              }
              p2 = pcVar1 + 2;
            }
            else {
              hi->length = (hi->response).content_length;
            }
          }
          else {
            http_header(hi,p2);
            p2 = pcVar1 + 2;
          }
        }
        if (((hi->response).chunked != '\x01') || (hi->length != -1)) break;
        sVar2 = hi->r_len - ((long)p2 - (long)hi->r_buf);
        if ((long)sVar2 < 1) {
          hi->r_len = 0;
          return 0;
        }
        pcVar1 = strstr(p2,"\r\n");
        if (pcVar1 == (char *)0x0) {
          strncpy(hi->r_buf,p2,sVar2);
          *(undefined1 *)((long)hi + sVar2 + 0x2210) = 0;
          hi->r_len = sVar2;
          hi->length = -1;
          return 0;
        }
        *pcVar1 = '\0';
        lVar3 = strtol(p2,(char **)0x0,0x10);
        hi->length = lVar3;
        if (lVar3 == 0) {
          (hi->response).chunked = '\0';
        }
        else {
          (hi->response).content_length = hi->length + (hi->response).content_length;
        }
        p2 = pcVar1 + 2;
      }
      if (0 < hi->length) break;
      if ((hi->response).chunked == '\0') {
        return 1;
      }
      if ((hi->r_len < 3) || (*(short *)p2 != 0xa0d)) {
        hi->length = -1;
        hi->r_len = 0;
      }
      else {
        p2 = p2 + 2;
        hi->length = -1;
      }
    }
    sVar2 = hi->r_len - ((long)p2 - (long)hi->r_buf);
    if ((long)sVar2 <= hi->length) {
      if (hi->body_len < hi->body_size + -1) {
        if ((long)(hi->body_len + sVar2) < hi->body_size) {
          strncpy(hi->body + hi->body_len,p2,sVar2);
          hi->body_len = sVar2 + hi->body_len;
          hi->body[hi->body_len] = '\0';
        }
        else {
          strncpy(hi->body + hi->body_len,p2,(hi->body_size - hi->body_len) - 1);
          hi->body_len = hi->body_size + -1;
          hi->body[hi->body_len] = '\0';
        }
      }
      hi->length = hi->length - sVar2;
      hi->r_len = 0;
      if ((hi->response).chunked == '\0') {
        if (hi->length < 1) {
          return 1;
        }
        return 0;
      }
      return 0;
    }
    if (hi->body_len < hi->body_size + -1) {
      if (hi->body_len + hi->length < hi->body_size) {
        strncpy(hi->body + hi->body_len,p2,hi->length);
        hi->body_len = hi->length + hi->body_len;
        hi->body[hi->body_len] = '\0';
      }
      else {
        strncpy(hi->body + hi->body_len,p2,(hi->body_size - hi->body_len) - 1);
        hi->body_len = hi->body_size + -1;
        hi->body[hi->body_len] = '\0';
      }
    }
    if (((hi->response).chunked != '\x01') || ((long)(sVar2 - hi->length) < 2)) break;
    p2 = p2 + hi->length + 2;
    hi->length = -1;
  }
  return -1;
}

Assistant:

static int http_parse(HTTP_INFO *hi)
{
    char    *p1, *p2;
    long    len;


    if(hi->r_len <= 0) return -1;

    p1 = hi->r_buf;

    while(1)
    {
        if(hi->header_end == FALSE)     // header parser
        {
            if((p2 = strstr(p1, "\r\n")) != NULL)
            {
                len = (long)(p2 - p1);
                *p2 = 0;

                if(len > 0)
                {
                    // printf("header: %s(%ld)\n", p1, len);

                    http_header(hi, p1);
                    p1 = p2 + 2;    // skip CR+LF
                }
                else
                {
                    hi->header_end = TRUE; // reach the header-end.

                    // printf("header_end .... \n");

                    p1 = p2 + 2;    // skip CR+LF

                    if(hi->response.chunked == TRUE)
                    {
                        len = hi->r_len - (p1 - hi->r_buf);
                        if(len > 0)
                        {
                            if((p2 = strstr(p1, "\r\n")) != NULL)
                            {
                                *p2 = 0;

                                if((hi->length = strtol(p1, NULL, 16)) == 0)
                                {
                                    hi->response.chunked = FALSE;
                                }
                                else
                                {
                                    hi->response.content_length += hi->length;
                                }
                                p1 = p2 + 2;    // skip CR+LF
                            }
                            else
                            {
                                // copy the data as chunked size ...
                                strncpy(hi->r_buf, p1, len);
                                hi->r_buf[len] = 0;
                                hi->r_len = len;
                                hi->length = -1;

                                break;
                            }
                        }
                        else
                        {
                            hi->r_len = 0;
                            hi->length = -1;

                            break;
                        }
                    }
                    else
                    {
                        hi->length = hi->response.content_length;
                    }
                }

            }
            else
            {
                len = hi->r_len - (p1 - hi->r_buf);
                if(len  > 0)
                {
                    // keep the partial header data ...
                    strncpy(hi->r_buf, p1, len);
                    hi->r_buf[len] = 0;
                    hi->r_len = len;
                }
                else
                {
                    hi->r_len = 0;
                }

                break;
            }
        }
        else    // body parser ...
        {
            if(hi->response.chunked == TRUE && hi->length == -1)
            {
                len = hi->r_len - (p1 - hi->r_buf);
                if(len > 0)
                {
                    if ((p2 = strstr(p1, "\r\n")) != NULL)
                    {
                        *p2 = 0;

                        if((hi->length = strtol(p1, NULL, 16)) == 0)
                        {
                            hi->response.chunked = FALSE;
                        }
                        else
                        {
                            hi->response.content_length += hi->length;
                        }

                        p1 = p2 + 2;    // skip CR+LF
                    }
                    else
                    {
                        // copy the remain data as chunked size ...
                        strncpy(hi->r_buf, p1, len);
                        hi->r_buf[len] = 0;
                        hi->r_len = len;
                        hi->length = -1;

                        break;
                    }
                }
                else
                {
                    hi->r_len = 0;

                    break;
                }
            }
            else
            {
                if(hi->length > 0)
                {
                    len = hi->r_len - (p1 - hi->r_buf);

                    if(len > hi->length)
                    {
                        // copy the data for response ..
                        if(hi->body_len < hi->body_size-1)
                        {
                            if (hi->body_size > (hi->body_len + hi->length))
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->length);
                                hi->body_len += hi->length;
                                hi->body[hi->body_len] = 0;
                            }
                            else
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->body_size - hi->body_len - 1);
                                hi->body_len = hi->body_size - 1;
                                hi->body[hi->body_len] = 0;
                            }
                        }

                        p1 += hi->length;
                        len -= hi->length;

                        if(hi->response.chunked == TRUE && len >= 2)
                        {
                            p1 += 2;    // skip CR+LF
                            hi->length = -1;
                        }
                        else
                        {
                            return -1;
                        }
                    }
                    else
                    {
                        // copy the data for response ..
                        if(hi->body_len < hi->body_size-1)
                        {
                            if (hi->body_size > (hi->body_len + len))
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, len);
                                hi->body_len += len;
                                hi->body[hi->body_len] = 0;
                            }
                            else
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->body_size - hi->body_len - 1);
                                hi->body_len = hi->body_size - 1;
                                hi->body[hi->body_len] = 0;
                            }
                        }

                        hi->length -= len;
                        hi->r_len = 0;

                        if(hi->response.chunked == FALSE && hi->length <= 0) return 1;

                        break;
                    }
                }
                else
                {
                    if(hi->response.chunked == FALSE) return 1;

                    // chunked size check ..
                    if((hi->r_len > 2) && (memcmp(p1, "\r\n", 2) == 0))
                    {
                        p1 += 2;
                        hi->length = -1;
                    }
                    else
                    {
                        hi->length = -1;
                        hi->r_len = 0;
                    }
                }
            }
        }
    }

    return 0;
}